

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaBinrIO.cpp
# Opt level: O0

long __thiscall NaBinaryStreamFile::CountOfRecord(NaBinaryStreamFile *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long __off;
  long lVar4;
  long in_RDI;
  long pos;
  long n;
  
  __off = ftell(*(FILE **)(in_RDI + 0x20));
  fseek(*(FILE **)(in_RDI + 0x20),0,2);
  lVar4 = ftell(*(FILE **)(in_RDI + 0x20));
  lVar2 = *(long *)(in_RDI + 0x48);
  lVar3 = *(long *)(in_RDI + 0x40);
  iVar1 = *(int *)(in_RDI + 0x38);
  fseek(*(FILE **)(in_RDI + 0x20),__off,0);
  return (ulong)(lVar4 - lVar2) / (ulong)(lVar3 * iVar1);
}

Assistant:

long
NaBinaryStreamFile::CountOfRecord ()
{
  long    n, pos;

  n = 0;
  pos = ftell(fp);

  /* goto end of file */
  fseek(fp, 0, SEEK_END);
  n = (ftell(fp) - oBinStream) / (nDataSize * nVar);

  /* return to old position */
  fseek(fp, pos, SEEK_SET);

  return n;
}